

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdn.c
# Opt level: O3

char * Qiniu_CDN_CreateTimestampAntiLeechURL
                 (char *host,char *fileName,char *queryStr,Qiniu_Uint64 deadline,char *cryptKey)

{
  char *pcVar1;
  char *addr;
  char *src;
  char *addr_00;
  char *pcVar2;
  Qiniu_Bool queryStrEscapeOk;
  Qiniu_Bool fileNameEscapeOk;
  char *local_50;
  char expireHex [20];
  
  addr = (char *)0x0;
  fileNameEscapeOk = 0;
  queryStrEscapeOk = 0;
  pcVar1 = Qiniu_PathEscape(fileName,&fileNameEscapeOk);
  snprintf(expireHex,0x14,"%0llx",deadline);
  if (queryStr != (char *)0x0) {
    if (*queryStr == '\0') {
      addr = (char *)0x0;
    }
    else {
      addr = Qiniu_PathEscape(queryStr,&queryStrEscapeOk);
    }
  }
  local_50 = pcVar1;
  pcVar1 = Qiniu_String_Concat2("/",pcVar1);
  src = Qiniu_String_Concat(cryptKey,pcVar1,expireHex,0);
  addr_00 = Qiniu_MD5_HexStr(src);
  if (addr == (char *)0x0) {
    pcVar2 = Qiniu_String_Concat(host,pcVar1,"?sign=",addr_00,"&t=",expireHex,0);
  }
  else {
    pcVar2 = Qiniu_String_Concat(host,pcVar1,"?",addr,"&sign=",addr_00,"&t=",expireHex,0);
  }
  if (fileNameEscapeOk == 1) {
    Qiniu_Free(local_50);
  }
  if (queryStrEscapeOk == 1) {
    Qiniu_Free(addr);
  }
  Qiniu_Free(pcVar1);
  Qiniu_Free(src);
  Qiniu_Free(addr_00);
  return pcVar2;
}

Assistant:

char *Qiniu_CDN_CreateTimestampAntiLeechURL(const char *host, const char *fileName, char *queryStr,
                                            Qiniu_Uint64 deadline, const char *cryptKey) {
    char *finalURL = NULL;
    Qiniu_Bool fileNameEscapeOk = Qiniu_False;
    Qiniu_Bool queryStrEscapeOk = Qiniu_False;
    char *fileNameEscaped = Qiniu_PathEscape(fileName, &fileNameEscapeOk);
    char *queryStrEscaped = NULL;

    char expireHex[20];
    snprintf(expireHex, 20, "%0llx", deadline);

    if (queryStr != NULL && strcmp("", queryStr) != 0) {
        queryStrEscaped = Qiniu_PathEscape(queryStr, &queryStrEscapeOk);
    }

    char *path = Qiniu_String_Concat2("/", fileNameEscaped);
    char *signStr = Qiniu_String_Concat(cryptKey, path, expireHex, NULL);
    char *sign = (char *) Qiniu_MD5_HexStr(signStr);

    if (queryStrEscaped != NULL) {
        finalURL = Qiniu_String_Concat(host, path, "?", queryStrEscaped, "&sign=", sign, "&t=", expireHex, NULL);
    } else {
        finalURL = Qiniu_String_Concat(host, path, "?sign=", sign, "&t=", expireHex, NULL);
    }

    if (fileNameEscapeOk == Qiniu_True) {
        Qiniu_Free(fileNameEscaped);
    }
    if (queryStrEscapeOk == Qiniu_True) {
        Qiniu_Free(queryStrEscaped);
    }
    Qiniu_Free(path);
    Qiniu_Free(signStr);
    Qiniu_Free(sign);
    return finalURL;
}